

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsPipeline.cpp
# Opt level: O0

Ptr<GraphicsPipeline>
myvk::GraphicsPipeline::Create
          (Ptr<PipelineLayout> *pipeline_layout,Ptr<RenderPass> *render_pass,
          VkGraphicsPipelineCreateInfo *create_info)

{
  PFN_vkCreateGraphicsPipelines p_Var1;
  VkResult VVar2;
  element_type *this;
  element_type *peVar3;
  element_type *peVar4;
  VkDevice pVVar5;
  VkPipelineCache this_00;
  element_type *peVar6;
  void *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<GraphicsPipeline> PVar7;
  VkGraphicsPipelineCreateInfo new_info;
  shared_ptr<myvk::GraphicsPipeline> ret;
  uint in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  shared_ptr<myvk::PipelineLayout> *in_stack_fffffffffffffed0;
  VkGraphicsPipelineCreateInfo local_c0;
  void *local_20;
  
  local_20 = in_RCX;
  std::make_shared<myvk::GraphicsPipeline>();
  std::__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2da0dd);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            (in_stack_fffffffffffffed0,
             (shared_ptr<myvk::PipelineLayout> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2da105);
  std::shared_ptr<myvk::RenderPass>::operator=
            ((shared_ptr<myvk::RenderPass> *)in_stack_fffffffffffffed0,
             (shared_ptr<myvk::RenderPass> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  memcpy(&local_c0,local_20,0x90);
  this = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2da13a);
  local_c0.renderPass = RenderPass::GetHandle(this);
  peVar3 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2da163);
  local_c0.layout = PipelineLayout::GetHandle(peVar3);
  p_Var1 = vkCreateGraphicsPipelines;
  peVar3 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2da19b);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar4 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2da1b8);
  pVVar5 = Device::GetHandle(peVar4);
  peVar3 = std::__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2da1d4);
  (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar4 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2da1f1);
  this_00 = Device::GetPipelineCacheHandle(peVar4);
  peVar6 = std::
           __shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2da20d);
  VVar2 = (*p_Var1)(pVVar5,this_00,1,&local_c0,(VkAllocationCallbacks *)0x0,
                    &(peVar6->super_PipelineBase).m_pipeline);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::GraphicsPipeline>::shared_ptr
              ((shared_ptr<myvk::GraphicsPipeline> *)this_00,
               (shared_ptr<myvk::GraphicsPipeline> *)(ulong)in_stack_fffffffffffffec8);
  }
  else {
    std::shared_ptr<myvk::GraphicsPipeline>::shared_ptr
              ((shared_ptr<myvk::GraphicsPipeline> *)this_00,
               (nullptr_t)CONCAT44(VVar2,in_stack_fffffffffffffec8));
  }
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x2da29f);
  PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<GraphicsPipeline>)
         PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<GraphicsPipeline> GraphicsPipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                               const Ptr<RenderPass> &render_pass,
                                               const VkGraphicsPipelineCreateInfo &create_info) {
	auto ret = std::make_shared<GraphicsPipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;
	ret->m_render_pass_ptr = render_pass;

	VkGraphicsPipelineCreateInfo new_info = create_info;
	new_info.renderPass = render_pass->GetHandle();
	new_info.layout = pipeline_layout->GetHandle();

	if (vkCreateGraphicsPipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                              pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &new_info, nullptr,
	                              &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}